

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

DataSegment * __thiscall
wasm::Module::addDataSegment
          (Module *this,unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr
          )

{
  DataSegment *pDVar1;
  string local_40;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).
       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
       super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = (DataSegment *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addDataSegment","");
  pDVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>,std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>,wasm::DataSegment>
                     (&this->dataSegments,&this->dataSegmentsMap,
                      (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      &local_20,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl != (DataSegment *)0x0) {
    std::default_delete<wasm::DataSegment>::operator()
              ((default_delete<wasm::DataSegment> *)&local_20,local_20._M_head_impl);
  }
  return pDVar1;
}

Assistant:

DataSegment* Module::addDataSegment(std::unique_ptr<DataSegment>&& curr) {
  return addModuleElement(
    dataSegments, dataSegmentsMap, std::move(curr), "addDataSegment");
}